

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::basic_csv_parser
          (basic_csv_parser<char,_std::allocator<char>_> *this,
          basic_csv_decode_options<char> *options,
          function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *alloc)

{
  bool bVar1;
  char_type cVar2;
  csv_mapping_kind cVar3;
  undefined1 uVar4;
  _func_int **pp_Var5;
  allocator *in_RCX;
  basic_csv_decode_options<char> *in_RSI;
  ser_context *in_RDI;
  vector<jsoncons::csv::csv_type_info,_std::allocator<jsoncons::csv::csv_type_info>_>
  *in_stack_00000148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000150;
  basic_csv_decode_options<char> *in_stack_fffffffffffffd28;
  basic_csv_parser<char,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  chars_to *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  m_columns_filter<char,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  basic_csv_options_common<char> *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cont;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *names;
  string local_f0 [32];
  string local_d0 [32];
  double local_b0;
  string local_a8 [32];
  double local_88;
  string local_80 [32];
  double local_60;
  string local_58 [41];
  undefined1 local_2f [47];
  
  local_2f._15_8_ = in_RCX;
  local_2f._31_8_ = in_RSI;
  ser_context::ser_context(in_RDI);
  in_RDI->_vptr_ser_context = (_func_int **)&PTR__basic_csv_parser_01339458;
  std::allocator<char>::allocator((allocator *)(in_RDI + 1));
  *(undefined4 *)((long)&in_RDI[1]._vptr_ser_context + 4) = 0;
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)
             in_stack_fffffffffffffd40,
             (function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
  in_RDI[6]._vptr_ser_context = (_func_int **)0x1;
  in_RDI[7]._vptr_ser_context = (_func_int **)0x1;
  *(undefined4 *)&in_RDI[8]._vptr_ser_context = 3;
  bVar1 = basic_csv_decode_options<char>::assume_header
                    ((basic_csv_decode_options<char> *)local_2f._31_8_);
  *(bool *)((long)&in_RDI[8]._vptr_ser_context + 4) = bVar1;
  cVar2 = basic_csv_decode_options<char>::comment_starter
                    ((basic_csv_decode_options<char> *)local_2f._31_8_);
  *(char_type *)((long)&in_RDI[8]._vptr_ser_context + 5) = cVar2;
  cVar2 = basic_csv_options_common<char>::field_delimiter
                    ((basic_csv_options_common<char> *)
                     ((long)(_func_int ***)local_2f._31_8_ +
                     (long)(*(_func_int ***)local_2f._31_8_)[-3]));
  *(char_type *)((long)&in_RDI[8]._vptr_ser_context + 6) = cVar2;
  pp_Var5 = (_func_int **)
            basic_csv_decode_options<char>::header_lines
                      ((basic_csv_decode_options<char> *)local_2f._31_8_);
  in_RDI[9]._vptr_ser_context = pp_Var5;
  bVar1 = basic_csv_decode_options<char>::ignore_empty_values
                    ((basic_csv_decode_options<char> *)local_2f._31_8_);
  *(bool *)&in_RDI[10]._vptr_ser_context = bVar1;
  bVar1 = basic_csv_decode_options<char>::ignore_empty_lines
                    ((basic_csv_decode_options<char> *)local_2f._31_8_);
  *(bool *)((long)&in_RDI[10]._vptr_ser_context + 1) = bVar1;
  bVar1 = basic_csv_decode_options<char>::infer_types
                    ((basic_csv_decode_options<char> *)local_2f._31_8_);
  *(bool *)((long)&in_RDI[10]._vptr_ser_context + 2) = bVar1;
  bVar1 = basic_csv_decode_options<char>::lossless_number
                    ((basic_csv_decode_options<char> *)local_2f._31_8_);
  *(bool *)((long)&in_RDI[10]._vptr_ser_context + 3) = bVar1;
  cVar3 = basic_csv_decode_options<char>::mapping_kind
                    ((basic_csv_decode_options<char> *)in_stack_fffffffffffffd30);
  *(csv_mapping_kind *)((long)&in_RDI[10]._vptr_ser_context + 4) = cVar3;
  pp_Var5 = (_func_int **)
            basic_csv_decode_options<char>::max_lines
                      ((basic_csv_decode_options<char> *)local_2f._31_8_);
  in_RDI[0xb]._vptr_ser_context = pp_Var5;
  cVar2 = basic_csv_options_common<char>::quote_char
                    ((basic_csv_options_common<char> *)
                     ((long)(_func_int ***)local_2f._31_8_ +
                     (long)(*(_func_int ***)local_2f._31_8_)[-3]));
  *(char_type *)&in_RDI[0xc]._vptr_ser_context = cVar2;
  cVar2 = basic_csv_options_common<char>::quote_escape_char
                    ((basic_csv_options_common<char> *)
                     ((long)(_func_int ***)local_2f._31_8_ +
                     (long)(*(_func_int ***)local_2f._31_8_)[-3]));
  *(char_type *)((long)&in_RDI[0xc]._vptr_ser_context + 1) = cVar2;
  cVar2 = basic_csv_options_common<char>::subfield_delimiter
                    ((basic_csv_options_common<char> *)
                     ((long)(_func_int ***)local_2f._31_8_ +
                     (long)(*(_func_int ***)local_2f._31_8_)[-3]));
  *(char_type *)((long)&in_RDI[0xc]._vptr_ser_context + 2) = cVar2;
  bVar1 = basic_csv_decode_options<char>::trim_leading
                    ((basic_csv_decode_options<char> *)local_2f._31_8_);
  *(bool *)((long)&in_RDI[0xc]._vptr_ser_context + 3) = bVar1;
  bVar1 = basic_csv_decode_options<char>::trim_leading_inside_quotes
                    ((basic_csv_decode_options<char> *)local_2f._31_8_);
  *(bool *)((long)&in_RDI[0xc]._vptr_ser_context + 4) = bVar1;
  bVar1 = basic_csv_decode_options<char>::trim_trailing
                    ((basic_csv_decode_options<char> *)local_2f._31_8_);
  *(bool *)((long)&in_RDI[0xc]._vptr_ser_context + 5) = bVar1;
  bVar1 = basic_csv_decode_options<char>::trim_trailing_inside_quotes
                    ((basic_csv_decode_options<char> *)local_2f._31_8_);
  *(bool *)((long)&in_RDI[0xc]._vptr_ser_context + 6) = bVar1;
  bVar1 = basic_csv_decode_options<char>::unquoted_empty_value_is_null
                    ((basic_csv_decode_options<char> *)local_2f._31_8_);
  *(bool *)((long)&in_RDI[0xc]._vptr_ser_context + 7) = bVar1;
  in_RDI[0xd]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[0xe]._vptr_ser_context = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[0xf]._vptr_ser_context = 0;
  in_RDI[0x10]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[0x11]._vptr_ser_context = (_func_int **)0x0;
  jsoncons::detail::chars_to::chars_to(in_stack_fffffffffffffd40);
  in_RDI[0x16]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[0x17]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[0x18]._vptr_ser_context = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[0x19]._vptr_ser_context = 1;
  in_RDI[0x1a]._vptr_ser_context = (_func_int **)0x1;
  *(undefined1 *)&in_RDI[0x1b]._vptr_ser_context = 0;
  *(undefined1 *)((long)&in_RDI[0x1b]._vptr_ser_context + 1) = 0;
  *(undefined4 *)((long)&in_RDI[0x1b]._vptr_ser_context + 4) = 0;
  in_RDI[0x1c]._vptr_ser_context = (_func_int **)0x0;
  detail::m_columns_filter<char,_std::allocator<char>_>::m_columns_filter
            (in_stack_fffffffffffffd50,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
  this_00 = (basic_csv_options_common<char> *)(in_RDI + 0x2a);
  std::allocator<jsoncons::csv::csv_mode>::allocator<char>
            ((allocator<jsoncons::csv::csv_mode> *)in_stack_fffffffffffffd30,
             (allocator<char> *)in_stack_fffffffffffffd28);
  std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::vector
            ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
             in_stack_fffffffffffffd30,(allocator_type *)in_stack_fffffffffffffd28);
  std::allocator<jsoncons::csv::csv_mode>::~allocator
            ((allocator<jsoncons::csv::csv_mode> *)0x3ea59f);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator<char>((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffd30,(allocator<char> *)in_stack_fffffffffffffd28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffd30,(allocator_type *)in_stack_fffffffffffffd28);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x3ea5e5);
  cont = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(in_RDI + 0x30);
  names = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f;
  std::allocator<jsoncons::csv::csv_type_info>::allocator<char>
            ((allocator<jsoncons::csv::csv_type_info> *)in_stack_fffffffffffffd30,
             (allocator<char> *)in_stack_fffffffffffffd28);
  std::vector<jsoncons::csv::csv_type_info,_std::allocator<jsoncons::csv::csv_type_info>_>::vector
            ((vector<jsoncons::csv::csv_type_info,_std::allocator<jsoncons::csv::csv_type_info>_> *)
             in_stack_fffffffffffffd30,(allocator_type *)in_stack_fffffffffffffd28);
  std::allocator<jsoncons::csv::csv_type_info>::~allocator
            ((allocator<jsoncons::csv::csv_type_info> *)0x3ea62b);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator<char>((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffd30,(allocator<char> *)in_stack_fffffffffffffd28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffd30,(allocator_type *)in_stack_fffffffffffffd28);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x3ea671);
  std::allocator<jsoncons::csv::csv_parse_state>::allocator<char>
            ((allocator<jsoncons::csv::csv_parse_state> *)in_stack_fffffffffffffd30,
             (allocator<char> *)in_stack_fffffffffffffd28);
  std::vector<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>::
  vector((vector<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_> *)
         in_stack_fffffffffffffd30,(allocator_type *)in_stack_fffffffffffffd28);
  std::allocator<jsoncons::csv::csv_parse_state>::~allocator
            ((allocator<jsoncons::csv::csv_parse_state> *)0x3ea6b7);
  std::__cxx11::string::string((string *)(in_RDI + 0x39),(allocator *)local_2f._15_8_);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
            *)0x3ea6f7);
  bVar1 = basic_csv_options_common<char>::enable_str_to_nan
                    ((basic_csv_options_common<char> *)
                     ((long)(_func_int ***)local_2f._31_8_ +
                     (long)(*(_func_int ***)local_2f._31_8_)[-3]));
  if (bVar1) {
    basic_csv_options_common<char>::nan_to_str_abi_cxx11_
              ((basic_csv_options_common<char> *)in_stack_fffffffffffffd28);
    local_60 = nan("");
    std::
    vector<std::pair<std::__cxx11::string,double>,std::allocator<std::pair<std::__cxx11::string,double>>>
    ::emplace_back<std::__cxx11::string,double>
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)in_stack_fffffffffffffd40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (double *)in_stack_fffffffffffffd30);
    std::__cxx11::string::~string(local_58);
  }
  bVar1 = basic_csv_options_common<char>::enable_str_to_inf
                    ((basic_csv_options_common<char> *)
                     ((long)(_func_int ***)local_2f._31_8_ +
                     (long)(*(_func_int ***)local_2f._31_8_)[-3]));
  if (bVar1) {
    in_stack_fffffffffffffd40 = (chars_to *)(in_RDI + 0x3d);
    basic_csv_options_common<char>::inf_to_str_abi_cxx11_
              ((basic_csv_options_common<char> *)in_stack_fffffffffffffd28);
    local_88 = std::numeric_limits<double>::infinity();
    std::
    vector<std::pair<std::__cxx11::string,double>,std::allocator<std::pair<std::__cxx11::string,double>>>
    ::emplace_back<std::__cxx11::string,double>
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)in_stack_fffffffffffffd40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (double *)in_stack_fffffffffffffd30);
    std::__cxx11::string::~string(local_80);
  }
  uVar4 = basic_csv_options_common<char>::enable_str_to_neginf
                    ((basic_csv_options_common<char> *)
                     ((long)(_func_int ***)local_2f._31_8_ +
                     (long)(*(_func_int ***)local_2f._31_8_)[-3]));
  if ((bool)uVar4) {
    in_stack_fffffffffffffd30 = (basic_csv_parser<char,_std::allocator<char>_> *)(in_RDI + 0x3d);
    basic_csv_options_common<char>::neginf_to_str_abi_cxx11_(this_00);
    local_b0 = std::numeric_limits<double>::infinity();
    local_b0 = -local_b0;
    std::
    vector<std::pair<std::__cxx11::string,double>,std::allocator<std::pair<std::__cxx11::string,double>>>
    ::emplace_back<std::__cxx11::string,double>
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)in_stack_fffffffffffffd40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar4,in_stack_fffffffffffffd38),(double *)in_stack_fffffffffffffd30);
    std::__cxx11::string::~string(local_a8);
  }
  basic_csv_decode_options<char>::column_types_abi_cxx11_(in_stack_fffffffffffffd28);
  detail::
  parse_column_types<char,std::vector<jsoncons::csv::csv_type_info,std::allocator<jsoncons::csv::csv_type_info>>>
            (in_stack_00000150,in_stack_00000148);
  std::__cxx11::string::~string(local_d0);
  basic_csv_decode_options<char>::column_defaults_abi_cxx11_(in_stack_fffffffffffffd28);
  detail::
  parse_column_names<char,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (names,cont);
  std::__cxx11::string::~string(local_f0);
  basic_csv_options_common<char>::column_names_abi_cxx11_
            ((basic_csv_options_common<char> *)
             ((long)(_func_int ***)local_2f._31_8_ + (long)(*(_func_int ***)local_2f._31_8_)[-3]));
  detail::
  parse_column_names<char,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (names,cont);
  pp_Var5 = (_func_int **)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x2d));
  in_RDI[0xd]._vptr_ser_context = pp_Var5;
  initialize(in_stack_fffffffffffffd30);
  return;
}

Assistant:

basic_csv_parser(const basic_csv_decode_options<CharT>& options,
                     std::function<bool(csv_errc,const ser_context&)> err_handler,
                     const TempAllocator& alloc = TempAllocator())
       : alloc_(alloc),
         state_(csv_parse_state::start),
         err_handler_(err_handler),
         assume_header_(options.assume_header()),                  
         comment_starter_(options.comment_starter()),
         field_delimiter_(options.field_delimiter()),
         header_lines_(options.header_lines()),
         ignore_empty_values_(options.ignore_empty_values()),
         ignore_empty_lines_(options.ignore_empty_lines()),
         infer_types_(options.infer_types()),
         lossless_number_(options.lossless_number()), 
         mapping_kind_(options.mapping_kind()),
         max_lines_(options.max_lines()),
         quote_char_(options.quote_char()),
         quote_escape_char_(options.quote_escape_char()),
         subfield_delimiter_(options.subfield_delimiter()),
         trim_leading_(options.trim_leading()),
         trim_leading_inside_quotes_(options.trim_leading_inside_quotes()),
         trim_trailing_(options.trim_trailing()),
         trim_trailing_inside_quotes_(options.trim_trailing_inside_quotes()),
         unquoted_empty_value_is_null_(options.unquoted_empty_value_is_null()),
         m_columns_filter_(alloc),
         stack_(alloc),
         column_names_(alloc),
         column_types_(alloc),
         column_defaults_(alloc),
         state_stack_(alloc),
         buffer_(alloc)
    {
        if (options.enable_str_to_nan())
        {
            string_double_map_.emplace_back(options.nan_to_str(),std::nan(""));
        }
        if (options.enable_str_to_inf())
        {
            string_double_map_.emplace_back(options.inf_to_str(),std::numeric_limits<double>::infinity());
        }
        if (options.enable_str_to_neginf())
        {
            string_double_map_.emplace_back(options.neginf_to_str(),-std::numeric_limits<double>::infinity());
        }

        jsoncons::csv::detail::parse_column_types(options.column_types(), column_types_);
        jsoncons::csv::detail::parse_column_names(options.column_defaults(), column_defaults_);
        jsoncons::csv::detail::parse_column_names(options.column_names(), column_names_);
        min_column_names_ = column_names_.size();
        initialize();
    }